

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funpack.c
# Opt level: O0

int fu_get_param(int argc,char **argv,fpstate *fpptr)

{
  size_t sVar1;
  char tile [513];
  int iarg;
  fpstate *fpptr_local;
  char **argv_local;
  int argc_local;
  
  if (fpptr->initialized != 0x2a) {
    fp_msg("Error: internal initialization error\n");
    exit(-1);
  }
  fpptr->delete_suffix = 1;
  tile[0x1fc] = '\x01';
  tile[0x1fd] = '\0';
  tile[0x1fe] = '\0';
  tile[0x1ff] = '\0';
  while ((((int)tile._508_4_ < argc && (*argv[(int)tile._508_4_] == '-')) &&
         (sVar1 = strlen(argv[(int)tile._508_4_]), sVar1 == 2))) {
    if (argv[(int)tile._508_4_][1] == 'F') {
      fpptr->clobber = fpptr->clobber + 1;
      fpptr->delete_suffix = 0;
    }
    else if (argv[(int)tile._508_4_][1] == 'D') {
      fpptr->delete_input = fpptr->delete_input + 1;
    }
    else if (argv[(int)tile._508_4_][1] == 'P') {
      tile._508_4_ = tile._508_4_ + 1;
      if (argc <= (int)tile._508_4_) {
        fu_usage();
        fu_hint();
        exit(-1);
      }
      strncpy(fpptr->prefix,argv[(int)tile._508_4_],0x200);
      fpptr->prefix[0x200] = '\0';
    }
    else if (argv[(int)tile._508_4_][1] == 'E') {
      tile._508_4_ = tile._508_4_ + 1;
      if (argc <= (int)tile._508_4_) {
        fu_usage();
        fu_hint();
        exit(-1);
      }
      strncpy(fpptr->extname,argv[(int)tile._508_4_],0x200);
      fpptr->extname[0x200] = '\0';
    }
    else if (argv[(int)tile._508_4_][1] == 'S') {
      fpptr->to_stdout = fpptr->to_stdout + 1;
    }
    else if (argv[(int)tile._508_4_][1] == 'L') {
      fpptr->listonly = fpptr->listonly + 1;
    }
    else if (argv[(int)tile._508_4_][1] == 'C') {
      fpptr->do_checksums = 0;
    }
    else {
      if (argv[(int)tile._508_4_][1] == 'H') {
        fu_help();
        exit(0);
      }
      if (argv[(int)tile._508_4_][1] == 'V') {
        fp_version();
        exit(0);
      }
      if (argv[(int)tile._508_4_][1] == 'Z') {
        fpptr->do_gzip_file = fpptr->do_gzip_file + 1;
      }
      else if (argv[(int)tile._508_4_][1] == 'v') {
        fpptr->verbose = 1;
      }
      else {
        if (argv[(int)tile._508_4_][1] != 'O') {
          fp_msg("Error: unknown command line flag `");
          fp_msg(argv[(int)tile._508_4_]);
          fp_msg("\'\n");
          fu_usage();
          fu_hint();
          exit(-1);
        }
        tile._508_4_ = tile._508_4_ + 1;
        if (argc <= (int)tile._508_4_) {
          fu_usage();
          fu_hint();
          exit(-1);
        }
        strncpy(fpptr->outfile,argv[(int)tile._508_4_],0x200);
        fpptr->outfile[0x200] = '\0';
      }
    }
    tile._508_4_ = tile._508_4_ + 1;
  }
  if ((fpptr->extname[0] != '\0') && ((fpptr->clobber != 0 || (fpptr->delete_input != 0)))) {
    fp_msg("Error: -E option may not be used with -F or -D\n");
    fu_usage();
    exit(-1);
  }
  if ((fpptr->to_stdout != 0) && ((fpptr->outfile[0] != '\0' || (fpptr->prefix[0] != '\0')))) {
    fp_msg("Error: -S option may not be used with -P or -O\n");
    fu_usage();
    exit(-1);
  }
  if ((fpptr->outfile[0] != '\0') && (fpptr->prefix[0] != '\0')) {
    fp_msg("Error: -P and -O options may not be used together\n");
    fu_usage();
    exit(-1);
  }
  if ((int)tile._508_4_ < argc) {
    fpptr->firstfile = tile._508_4_;
    return 0;
  }
  fp_msg("Error: no FITS files to uncompress\n");
  fu_usage();
  exit(-1);
}

Assistant:

int fu_get_param (int argc, char *argv[], fpstate *fpptr)
{
	int	iarg;
	char	tile[SZ_STR];

        if (fpptr->initialized != FP_INIT_MAGIC) {
            fp_msg ("Error: internal initialization error\n"); exit (-1);
        }

	tile[0] = 0;

        /* by default, .fz suffix characters to be deleted from compressed file */
	fpptr->delete_suffix = 1;

	/* flags must come first and be separately specified
	 */
	for (iarg = 1; iarg < argc; iarg++) {
	    if (argv[iarg][0] == '-' && strlen (argv[iarg]) == 2) {

		if (argv[iarg][1] == 'F') {
		    fpptr->clobber++;
                    fpptr->delete_suffix = 0;  /* no suffix in this case */

		} else if (argv[iarg][1] == 'D') {
		    fpptr->delete_input++;

		} else if (argv[iarg][1] == 'P') {
		    if (++iarg >= argc) {
			fu_usage (); fu_hint (); exit (-1);
		    } else {
			strncpy (fpptr->prefix, argv[iarg], SZ_STR-1);
                        fpptr->prefix[SZ_STR-1] = 0;
                    }

		} else if (argv[iarg][1] == 'E') {
		    if (++iarg >= argc) {
			fu_usage (); fu_hint (); exit (-1);
		    } else {
			strncpy (fpptr->extname, argv[iarg], SZ_STR-1);
                        fpptr->extname[SZ_STR-1]=0;
                    }

		} else if (argv[iarg][1] == 'S') {
		    fpptr->to_stdout++;

		} else if (argv[iarg][1] == 'L') {
		    fpptr->listonly++;

		} else if (argv[iarg][1] == 'C') {
		    fpptr->do_checksums = 0;

		} else if (argv[iarg][1] == 'H') {
		    fu_help (); exit (0);

		} else if (argv[iarg][1] == 'V') {
		    fp_version (); exit (0);

		} else if (argv[iarg][1] == 'Z') {
		    fpptr->do_gzip_file++;

		} else if (argv[iarg][1] == 'v') {
		    fpptr->verbose = 1;

		} else if (argv[iarg][1] == 'O') {
		    if (++iarg >= argc) {
			fu_usage (); fu_hint (); exit (-1);
		    } else {
			strncpy (fpptr->outfile, argv[iarg], SZ_STR-1);
                        fpptr->outfile[SZ_STR-1]=0;
                    }

		} else {
		    fp_msg ("Error: unknown command line flag `");
		    fp_msg (argv[iarg]); fp_msg ("'\n");
		    fu_usage (); fu_hint (); exit (-1);
		}

	    } else
		break;
	}
	
	if (fpptr->extname[0] && (fpptr->clobber || fpptr->delete_input)) {
	    fp_msg ("Error: -E option may not be used with -F or -D\n");
	    fu_usage (); exit (-1);
        }

	if (fpptr->to_stdout && (fpptr->outfile[0] || fpptr->prefix[0]) ) {

	    fp_msg ("Error: -S option may not be used with -P or -O\n");
	    fu_usage (); exit (-1);
        }

	if (fpptr->outfile[0] && fpptr->prefix[0] ) {
	    fp_msg ("Error: -P and -O options may not be used together\n");
	    fu_usage (); exit (-1);
        }

	if (iarg >= argc) {
	    fp_msg ("Error: no FITS files to uncompress\n");
	    fu_usage (); exit (-1);
	} else
	    fpptr->firstfile = iarg;

	return(0);
}